

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_QName(void)

{
  char *pcVar1;
  char cVar2;
  XSValue *pXVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  Status SVar8;
  int iVar9;
  Status myStatus;
  StrX local_98;
  char iv_2 [4];
  char iv_3 [6];
  char v_3 [12];
  char iv_1 [14];
  char v_2 [15];
  char v_1 [16];
  int iVar10;
  
  builtin_strncpy(v_1,"   Ant:Eater  \n",0x10);
  builtin_strncpy(v_2,"Minimum_Length",0xf);
  builtin_strncpy(v_3,"abcde:a2345",0xc);
  builtin_strncpy(iv_1 + 8,"o:One",6);
  builtin_strncpy(iv_1,"Three:Tw",8);
  builtin_strncpy(iv_2,":my",4);
  builtin_strncpy(iv_3,"+name",6);
  myStatus = st_Init;
  StrX::StrX(&local_98,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1401,v_1,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1402,v_2,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 == '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1403,v_3,local_98.fLocalForm,1);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1406,iv_1,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1407,iv_2,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (cVar2 != '\0') {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1408,iv_3,local_98.fLocalForm,0);
    StrX::~StrX(&local_98);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_98,v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1422,v_1,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x1422;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1422,v_1);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_98,v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1423,v_2,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x1423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1423,v_2);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_98,v_3);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1424,v_3,pcVar1,"st_NoActVal",pcVar4);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x1424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1424,v_3);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_98,iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1428,iv_1,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x1428;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1428,iv_1);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_98,iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x142a,iv_2,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x142a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142a,iv_2);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    myStatus = st_Init;
    StrX::StrX(&local_98,iv_3);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    if (pXVar3 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar10 == 2) * 3 + st_NoActVal;
      iVar10 = iVar9;
      if (SVar8 != myStatus) {
        StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
        pcVar1 = local_98.fLocalForm;
        pcVar4 = getStatusString(SVar8);
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x142c,iv_3,pcVar1,pcVar4,pcVar5);
        StrX::~StrX(&local_98);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pvVar7 = (void *)0x142c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x142c,iv_3);
      StrX::~StrX(&local_98);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
      iVar10 = iVar9;
    }
  }
  iVar10 = 2;
LAB_0012a03a:
  iVar9 = iVar10 + -1;
  if (iVar10 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,v_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pcVar1 = local_98.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1449,v_1,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_98);
      goto LAB_0012a11f;
    }
  }
  else {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1449,v_1);
    StrX::~StrX(&local_98);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012a11f:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,v_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pcVar1 = local_98.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x144a,v_2,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_98);
      goto LAB_0012a201;
    }
  }
  else {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x144a,v_2);
    StrX::~StrX(&local_98);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012a201:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,v_3);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pcVar1 = local_98.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x144b,v_3,pcVar1,"st_NoCanRep",pcVar4);
      StrX::~StrX(&local_98);
      goto LAB_0012a2e3;
    }
  }
  else {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x144b,v_3);
    StrX::~StrX(&local_98);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012a2e3:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) {
    SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pcVar1 = local_98.fLocalForm;
      pcVar4 = getStatusString(SVar8);
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x144f,iv_1,pcVar1,pcVar4,pcVar5);
      StrX::~StrX(&local_98);
      goto LAB_0012a3dc;
    }
  }
  else {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x144f,iv_1);
    StrX::~StrX(&local_98);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012a3dc:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) {
    SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
      pcVar1 = local_98.fLocalForm;
      pcVar4 = getStatusString(SVar8);
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1451,iv_2,pcVar1,pcVar4,pcVar5);
      StrX::~StrX(&local_98);
      goto LAB_0012a4d5;
    }
  }
  else {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1451,iv_2);
    StrX::~StrX(&local_98);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0012a4d5:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_98,iv_3);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_98.fUnicodeForm,dt_QName,&myStatus,ver_10,iVar10 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_98);
  if (lVar6 == 0) goto LAB_0012a566;
  StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x1453,iv_3);
  StrX::~StrX(&local_98);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  goto LAB_0012a5ce;
LAB_0012a566:
  SVar8 = (uint)(iVar10 == 2) * 4 + st_NoCanRep;
  iVar10 = iVar9;
  if (SVar8 != myStatus) {
    StrX::StrX(&local_98,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
    pcVar1 = local_98.fLocalForm;
    pcVar4 = getStatusString(SVar8);
    pcVar5 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1453,iv_3,pcVar1,pcVar4,pcVar5);
    StrX::~StrX(&local_98);
LAB_0012a5ce:
    errSeen = 1;
    iVar10 = iVar9;
  }
  goto LAB_0012a03a;
}

Assistant:

void test_dt_QName()
{
    const XSValue::DataType dt = XSValue::dt_QName;
    bool  toValidate = true;

    const char v_1[]="   Ant:Eater  \n";
    const char v_2[]="Minimum_Length";
    const char v_3[]="abcde:a2345";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    const char iv_1[]="Three:Two:One";
    const char iv_2[]=":my";
    const char iv_3[]="+name";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
    }

}